

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressTestUtil.cpp
# Opt level: O2

ProgramContext * __thiscall
deqp::gls::LongStressTestUtil::ProgramLibrary::generateVertexUniformLoopLightContext
          (ProgramContext *__return_storage_ptr__,ProgramLibrary *this,int texWid,int texHei)

{
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *pvVar1;
  Vector<float,_4> local_1b0;
  string local_1a0;
  string ndxStr;
  int local_134;
  VarSpec local_130;
  Matrix<float,_4,_4> local_88;
  int local_48;
  int local_44;
  Vector<float,_4> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,
             "${VTX_HEADER}struct Material {\n\tmediump vec3 ambientColor;\n\tmediump vec4 diffuseColor;\n\tmediump vec3 emissiveColor;\n\tmediump vec3 specularColor;\n\tmediump float shininess;\n};\nstruct Light {\n\tmediump vec3 color;\n\tmediump vec4 position;\n\tmediump vec3 direction;\n\tmediump float constantAttenuation;\n\tmediump float linearAttenuation;\n\tmediump float quadraticAttenuation;\n\tmediump float spotExponent;\n\tmediump float spotCutoff;\n};\n${VTX_IN} highp vec4 a_position${NS};\n${VTX_IN} mediump vec3 a_normal${NS};\n${VTX_IN} mediump vec4 a_texCoord0${NS};\nuniform Material u_material${NS};\nuniform Light u_directionalLight${NS}[1];\nuniform mediump int u_directionalLightCount${NS};\nuniform Light u_spotLight${NS}[4];\nuniform mediump int u_spotLightCount${NS};\nuniform highp mat4 u_mvpMatrix${NS};\nuniform highp mat4 u_modelViewMatrix${NS};\nuniform mediump mat3 u_normalMatrix${NS};\nuniform mediump mat4 u_texCoordMatrix0${NS};\n${VTX_OUT} mediump vec4 v_color${NS};\n${VTX_OUT} mediump vec2 v_texCoord0${NS};\nmediump vec3 direction (mediump vec4 from, mediump vec4 to)\n{\n\treturn vec3(to.xyz * from.w - from.xyz * to.w);\n}\n\nmediump vec3 computeLighting (\n\tmediump vec3 directionToLight,\n\tmediump vec3 halfVector,\n\tmediump vec3 normal,\n\tmediump vec3 lightColor,\n\tmediump vec3 diffuseColor,\n\tmediump vec3 specularColor,\n\tmediump float shininess)\n{\n\tmediump float normalDotDirection  = max(dot(normal, directionToLight), 0.0);\n\tmediump vec3  color               = normalDotDirection * diffuseColor * lightColor;\n\n\tif (normalDotDirection != 0.0)\n\t\tcolor += pow(max(dot(normal, halfVector), 0.0), shininess) * specularColor * lightColor;\n\n\treturn color;\n}\n\nmediump float computeDistanceAttenuation (mediump float distToLight, mediump float constAtt, mediump float linearAtt, mediump float quadraticAtt)\n{\n\treturn 1.0 / (constAtt + linearAtt * distToLight + quadraticAtt * distToLight * distToLight);\n}\n\nmediump float computeSpotAttenuation (\n\tmediump vec3  directionToLight,\n\tmediump vec3  lightDir,\n\tmediump float spotExponent,\n\tmediump float spotCutoff)\n{\n\tmediump flo..." /* TRUNCATED STRING LITERAL */
             ,(allocator<char> *)&local_1b0);
  local_48 = texWid;
  local_44 = texHei;
  substitute(&local_130.name,this,&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,
             "${FRAG_HEADER}uniform sampler2D u_sampler0${NS};\n${FRAG_IN} mediump vec4 v_color${NS};\n${FRAG_IN} mediump vec2 v_texCoord0${NS};\nvoid main (void)\n{\n\tmediump vec2 texCoord0 = v_texCoord0${NS};\n\tmediump vec4 color = v_color${NS};\n\tcolor *= ${TEXTURE_2D_FUNC}(u_sampler0${NS}, texCoord0);\n\t${FRAG_COLOR} = color;\n}\n"
             ,(allocator<char> *)&local_40);
  substitute((string *)&local_88,this,&local_1a0);
  ProgramContext::ProgramContext
            (__return_storage_ptr__,local_130.name._M_dataplus._M_p,
             (char *)CONCAT44(local_88.m_data.m_data[0].m_data[1],
                              local_88.m_data.m_data[0].m_data[0]),"a_position${NS}");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"a_position${NS}",(allocator<char> *)&local_1b0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_88,-1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_1a0,1.0);
  VarSpec::VarSpec<tcu::Vector<float,4>>
            (&local_130,&ndxStr,(Vector<float,_4> *)&local_88,(Vector<float,_4> *)&local_1a0);
  pvVar1 = &__return_storage_ptr__->attributes;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"a_normal${NS}",(allocator<char> *)&local_1b0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_88,-1.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_1a0,1.0);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            (&local_130,&ndxStr,(Vector<float,_3> *)&local_88,(Vector<float,_3> *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"a_texCoord0${NS}",(allocator<char> *)&local_1b0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_88,-1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_1a0,1.0);
  VarSpec::VarSpec<tcu::Vector<float,4>>
            (&local_130,&ndxStr,(Vector<float,_4> *)&local_88,(Vector<float,_4> *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_material${NS}.ambientColor",(allocator<char> *)&local_1b0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_88,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_1a0,1.0);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            (&local_130,&ndxStr,(Vector<float,_3> *)&local_88,(Vector<float,_3> *)&local_1a0);
  pvVar1 = &__return_storage_ptr__->uniforms;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_material${NS}.diffuseColor",(allocator<char> *)&local_1b0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_88,0.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_1a0,1.0);
  VarSpec::VarSpec<tcu::Vector<float,4>>
            (&local_130,&ndxStr,(Vector<float,_4> *)&local_88,(Vector<float,_4> *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_material${NS}.emissiveColor",(allocator<char> *)&local_1b0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_88,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_1a0,1.0);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            (&local_130,&ndxStr,(Vector<float,_3> *)&local_88,(Vector<float,_3> *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_material${NS}.specularColor",(allocator<char> *)&local_1b0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_88,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_1a0,1.0);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            (&local_130,&ndxStr,(Vector<float,_3> *)&local_88,(Vector<float,_3> *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_material${NS}.shininess",(allocator<char> *)&local_1b0);
  local_88.m_data.m_data[0].m_data[0] = 0.0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x3f800000;
  VarSpec::VarSpec<float>(&local_130,&ndxStr,(float *)&local_88,(float *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_directionalLight${NS}[0].color",(allocator<char> *)&local_1b0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_88,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_1a0,1.0);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            (&local_130,&ndxStr,(Vector<float,_3> *)&local_88,(Vector<float,_3> *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_directionalLight${NS}[0].position",(allocator<char> *)&local_1b0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_88,-1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_1a0,1.0);
  VarSpec::VarSpec<tcu::Vector<float,4>>
            (&local_130,&ndxStr,(Vector<float,_4> *)&local_88,(Vector<float,_4> *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_directionalLight${NS}[0].direction",(allocator<char> *)&local_1b0)
  ;
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_88,-1.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_1a0,1.0);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            (&local_130,&ndxStr,(Vector<float,_3> *)&local_88,(Vector<float,_3> *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_directionalLight${NS}[0].constantAttenuation",
             (allocator<char> *)&local_1b0);
  local_88.m_data.m_data[0].m_data[0] = 0.1;
  local_1a0._M_dataplus._M_p._0_4_ = 0x3f800000;
  VarSpec::VarSpec<float>(&local_130,&ndxStr,(float *)&local_88,(float *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_directionalLight${NS}[0].linearAttenuation",
             (allocator<char> *)&local_1b0);
  local_88.m_data.m_data[0].m_data[0] = 0.1;
  local_1a0._M_dataplus._M_p._0_4_ = 0x3f800000;
  VarSpec::VarSpec<float>(&local_130,&ndxStr,(float *)&local_88,(float *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_directionalLight${NS}[0].quadraticAttenuation",
             (allocator<char> *)&local_1b0);
  local_88.m_data.m_data[0].m_data[0] = 0.1;
  local_1a0._M_dataplus._M_p._0_4_ = 0x3f800000;
  VarSpec::VarSpec<float>(&local_130,&ndxStr,(float *)&local_88,(float *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_directionalLight${NS}[0].spotExponent",
             (allocator<char> *)&local_1b0);
  local_88.m_data.m_data[0].m_data[0] = 0.1;
  local_1a0._M_dataplus._M_p._0_4_ = 0x3f800000;
  VarSpec::VarSpec<float>(&local_130,&ndxStr,(float *)&local_88,(float *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_directionalLight${NS}[0].spotCutoff",(allocator<char> *)&local_1b0
            );
  local_88.m_data.m_data[0].m_data[0] = 0.1;
  local_1a0._M_dataplus._M_p._0_4_ = 0x3f800000;
  VarSpec::VarSpec<float>(&local_130,&ndxStr,(float *)&local_88,(float *)&local_1a0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_directionalLightCount${NS}",(allocator<char> *)&local_1a0);
  local_88.m_data.m_data[0].m_data[0] = 1.4013e-45;
  VarSpec::VarSpec<int>(&local_130,&ndxStr,(int *)&local_88);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  for (local_134 = 0; local_134 < 4; local_134 = local_134 + 1) {
    de::toString<int>(&ndxStr,&local_134);
    std::operator+(&local_1a0,"u_spotLight${NS}[",&ndxStr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                   &local_1a0,"].color");
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_1b0,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_40,1.0);
    VarSpec::VarSpec<tcu::Vector<float,3>>
              (&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               (Vector<float,_3> *)&local_1b0,(Vector<float,_3> *)&local_40);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::operator+(&local_1a0,"u_spotLight${NS}[",&ndxStr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                   &local_1a0,"].position");
    tcu::Vector<float,_4>::Vector(&local_1b0,-1.0);
    tcu::Vector<float,_4>::Vector(&local_40,1.0);
    VarSpec::VarSpec<tcu::Vector<float,4>>
              (&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               &local_1b0,&local_40);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::operator+(&local_1a0,"u_spotLight${NS}[",&ndxStr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                   &local_1a0,"].direction");
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_1b0,-1.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_40,1.0);
    VarSpec::VarSpec<tcu::Vector<float,3>>
              (&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               (Vector<float,_3> *)&local_1b0,(Vector<float,_3> *)&local_40);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::operator+(&local_1a0,"u_spotLight${NS}[",&ndxStr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                   &local_1a0,"].constantAttenuation");
    local_1b0.m_data[0] = 0.1;
    local_40.m_data[0] = 1.0;
    VarSpec::VarSpec<float>
              (&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               local_1b0.m_data,local_40.m_data);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::operator+(&local_1a0,"u_spotLight${NS}[",&ndxStr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                   &local_1a0,"].linearAttenuation");
    local_1b0.m_data[0] = 0.1;
    local_40.m_data[0] = 1.0;
    VarSpec::VarSpec<float>
              (&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               local_1b0.m_data,local_40.m_data);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::operator+(&local_1a0,"u_spotLight${NS}[",&ndxStr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                   &local_1a0,"].quadraticAttenuation");
    local_1b0.m_data[0] = 0.1;
    local_40.m_data[0] = 1.0;
    VarSpec::VarSpec<float>
              (&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               local_1b0.m_data,local_40.m_data);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::operator+(&local_1a0,"u_spotLight${NS}[",&ndxStr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                   &local_1a0,"].spotExponent");
    local_1b0.m_data[0] = 0.1;
    local_40.m_data[0] = 1.0;
    VarSpec::VarSpec<float>
              (&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               local_1b0.m_data,local_40.m_data);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::operator+(&local_1a0,"u_spotLight${NS}[",&ndxStr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                   &local_1a0,"].spotCutoff");
    local_1b0.m_data[0] = 0.1;
    local_40.m_data[0] = 1.0;
    VarSpec::VarSpec<float>
              (&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               local_1b0.m_data,local_40.m_data);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
    emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&ndxStr);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_spotLightCount${NS}",(allocator<char> *)&local_1a0);
  local_88.m_data.m_data[0].m_data[0] = 5.60519e-45;
  VarSpec::VarSpec<int>(&local_130,&ndxStr,(int *)&local_88);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"u_mvpMatrix${NS}",(allocator<char> *)&local_1b0);
  translationMat<4>((Matrix<float,_4,_4> *)&ndxStr,-0.2);
  translationMat<4>(&local_88,0.2);
  VarSpec::VarSpec<tcu::Matrix<float,4,4>>
            (&local_130,&local_1a0,(Matrix<float,_4,_4> *)&ndxStr,&local_88);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"u_modelViewMatrix${NS}",(allocator<char> *)&local_1b0);
  translationMat<4>((Matrix<float,_4,_4> *)&ndxStr,-0.2);
  translationMat<4>(&local_88,0.2);
  VarSpec::VarSpec<tcu::Matrix<float,4,4>>
            (&local_130,&local_1a0,(Matrix<float,_4,_4> *)&ndxStr,&local_88);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"u_normalMatrix${NS}",(allocator<char> *)&local_1b0);
  translationMat<3>((Matrix<float,_3,_3> *)&ndxStr,-0.2);
  translationMat<3>((Matrix<float,_3,_3> *)&local_88,0.2);
  VarSpec::VarSpec<tcu::Matrix<float,3,3>>
            (&local_130,&local_1a0,(Matrix<float,_3,_3> *)&ndxStr,(Matrix<float,_3,_3> *)&local_88);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"u_texCoordMatrix0${NS}",(allocator<char> *)&local_1b0);
  translationMat<4>((Matrix<float,_4,_4> *)&ndxStr,-0.2);
  translationMat<4>(&local_88,0.2);
  VarSpec::VarSpec<tcu::Matrix<float,4,4>>
            (&local_130,&local_1a0,(Matrix<float,_4,_4> *)&ndxStr,&local_88);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndxStr,"u_sampler0${NS}",(allocator<char> *)&local_1a0);
  local_88.m_data.m_data[0].m_data[0] = 0.0;
  VarSpec::VarSpec<int>(&local_130,&ndxStr,(int *)&local_88);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(pvVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&ndxStr);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&ndxStr,0.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_88,1.0);
  TextureSpec::TextureSpec
            ((TextureSpec *)&local_130,TEXTURETYPE_2D,0,local_48,local_44,0x1908,0x1401,0x1908,true,
             0x2601,0x2601,0x2901,0x2901,(Vec4 *)&ndxStr,(Vec4 *)&local_88);
  std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::
  emplace_back<deqp::gls::TextureSpec>
            (&__return_storage_ptr__->textureSpecs,(TextureSpec *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

gls::ProgramContext ProgramLibrary::generateVertexUniformLoopLightContext (const int texWid, const int texHei) const
{
	static const char* const vertexTemplate =
		"${VTX_HEADER}"
		"struct Material {\n"
		"	mediump vec3 ambientColor;\n"
		"	mediump vec4 diffuseColor;\n"
		"	mediump vec3 emissiveColor;\n"
		"	mediump vec3 specularColor;\n"
		"	mediump float shininess;\n"
		"};\n"
		"struct Light {\n"
		"	mediump vec3 color;\n"
		"	mediump vec4 position;\n"
		"	mediump vec3 direction;\n"
		"	mediump float constantAttenuation;\n"
		"	mediump float linearAttenuation;\n"
		"	mediump float quadraticAttenuation;\n"
		"	mediump float spotExponent;\n"
		"	mediump float spotCutoff;\n"
		"};\n"
		"${VTX_IN} highp vec4 a_position${NS};\n"
		"${VTX_IN} mediump vec3 a_normal${NS};\n"
		"${VTX_IN} mediump vec4 a_texCoord0${NS};\n"
		"uniform Material u_material${NS};\n"
		"uniform Light u_directionalLight${NS}[1];\n"
		"uniform mediump int u_directionalLightCount${NS};\n"
		"uniform Light u_spotLight${NS}[4];\n"
		"uniform mediump int u_spotLightCount${NS};\n"
		"uniform highp mat4 u_mvpMatrix${NS};\n"
		"uniform highp mat4 u_modelViewMatrix${NS};\n"
		"uniform mediump mat3 u_normalMatrix${NS};\n"
		"uniform mediump mat4 u_texCoordMatrix0${NS};\n"
		"${VTX_OUT} mediump vec4 v_color${NS};\n"
		"${VTX_OUT} mediump vec2 v_texCoord0${NS};\n"
		"mediump vec3 direction (mediump vec4 from, mediump vec4 to)\n"
		"{\n"
		"	return vec3(to.xyz * from.w - from.xyz * to.w);\n"
		"}\n"
		"\n"
		"mediump vec3 computeLighting (\n"
		"	mediump vec3 directionToLight,\n"
		"	mediump vec3 halfVector,\n"
		"	mediump vec3 normal,\n"
		"	mediump vec3 lightColor,\n"
		"	mediump vec3 diffuseColor,\n"
		"	mediump vec3 specularColor,\n"
		"	mediump float shininess)\n"
		"{\n"
		"	mediump float normalDotDirection  = max(dot(normal, directionToLight), 0.0);\n"
		"	mediump vec3  color               = normalDotDirection * diffuseColor * lightColor;\n"
		"\n"
		"	if (normalDotDirection != 0.0)\n"
		"		color += pow(max(dot(normal, halfVector), 0.0), shininess) * specularColor * lightColor;\n"
		"\n"
		"	return color;\n"
		"}\n"
		"\n"
		"mediump float computeDistanceAttenuation (mediump float distToLight, mediump float constAtt, mediump float linearAtt, mediump float quadraticAtt)\n"
		"{\n"
		"	return 1.0 / (constAtt + linearAtt * distToLight + quadraticAtt * distToLight * distToLight);\n"
		"}\n"
		"\n"
		"mediump float computeSpotAttenuation (\n"
		"	mediump vec3  directionToLight,\n"
		"	mediump vec3  lightDir,\n"
		"	mediump float spotExponent,\n"
		"	mediump float spotCutoff)\n"
		"{\n"
		"	mediump float spotEffect = dot(lightDir, normalize(-directionToLight));\n"
		"\n"
		"	if (spotEffect < spotCutoff)\n"
		"		spotEffect = 0.0;\n"
		"\n"
		"	spotEffect = pow(spotEffect, spotExponent);\n"
		"	return spotEffect;\n"
		"}\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	highp vec4 position = a_position${NS};\n"
		"	highp vec3 normal = a_normal${NS};\n"
		"	gl_Position = u_mvpMatrix${NS} * position;\n"
		"	v_texCoord0${NS} = (u_texCoordMatrix0${NS} * a_texCoord0${NS}).xy;\n"
		"	mediump vec4 color = vec4(u_material${NS}.emissiveColor, u_material${NS}.diffuseColor.a);\n"
		"\n"
		"	highp vec4 eyePosition = u_modelViewMatrix${NS} * position;\n"
		"	mediump vec3 eyeNormal = normalize(u_normalMatrix${NS} * normal);\n"
		"	for (int i = 0; i < u_directionalLightCount${NS}; i++)\n"
		"	{\n"
		"		mediump vec3 directionToLight = -u_directionalLight${NS}[i].direction;\n"
		"		mediump vec3 halfVector = normalize(directionToLight + vec3(0.0, 0.0, 1.0));\n"
		"		color.rgb += computeLighting(directionToLight, halfVector, eyeNormal, u_directionalLight${NS}[i].color, u_material${NS}.diffuseColor.rgb, u_material${NS}.specularColor, u_material${NS}.shininess);\n"
		"	}\n"
		"\n"
		"	for (int i = 0; i < u_spotLightCount${NS}; i++)\n"
		"	{\n"
		"		mediump float distanceToLight = distance(eyePosition, u_spotLight${NS}[i].position);\n"
		"		mediump vec3 directionToLight = normalize(direction(eyePosition, u_spotLight${NS}[i].position));\n"
		"		mediump vec3 halfVector = normalize(directionToLight + vec3(0.0, 0.0, 1.0));\n"
		"		color.rgb += computeLighting(directionToLight, halfVector, eyeNormal, u_spotLight${NS}[i].color, u_material${NS}.diffuseColor.rgb, u_material${NS}.specularColor, u_material${NS}.shininess) * computeDistanceAttenuation(distanceToLight, u_spotLight${NS}[i].constantAttenuation, u_spotLight${NS}[i].linearAttenuation, u_spotLight${NS}[i].quadraticAttenuation) * computeSpotAttenuation(directionToLight, u_spotLight${NS}[i].direction, u_spotLight${NS}[i].spotExponent, u_spotLight${NS}[i].spotCutoff);\n"
		"	}\n"
		"\n"
		"\n"
		"	v_color${NS} = color;\n"
		"}\n";

	static const char* const fragmentTemplate =
		"${FRAG_HEADER}"
		"uniform sampler2D u_sampler0${NS};\n"
		"${FRAG_IN} mediump vec4 v_color${NS};\n"
		"${FRAG_IN} mediump vec2 v_texCoord0${NS};\n"
		"void main (void)\n"
		"{\n"
		"	mediump vec2 texCoord0 = v_texCoord0${NS};\n"
		"	mediump vec4 color = v_color${NS};\n"
		"	color *= ${TEXTURE_2D_FUNC}(u_sampler0${NS}, texCoord0);\n"
		"	${FRAG_COLOR} = color;\n"
		"}\n";

	gls::ProgramContext context(substitute(vertexTemplate).c_str(), substitute(fragmentTemplate).c_str(), "a_position${NS}");

	context.attributes.push_back	(gls::VarSpec("a_position${NS}",									Vec4(-1.0f),				Vec4(1.0f)));
	context.attributes.push_back	(gls::VarSpec("a_normal${NS}",										Vec3(-1.0f),				Vec3(1.0f)));
	context.attributes.push_back	(gls::VarSpec("a_texCoord0${NS}",									Vec4(-1.0f),				Vec4(1.0f)));

	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.ambientColor",						Vec3(0.0f),					Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.diffuseColor",						Vec4(0.0f),					Vec4(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.emissiveColor",						Vec3(0.0f),					Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.specularColor",						Vec3(0.0f),					Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.shininess",							0.0f,						1.0f));

	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].color",					Vec3(0.0f),					Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].position",				Vec4(-1.0f),				Vec4(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].direction",				Vec3(-1.0f),				Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].constantAttenuation",		0.1f,						1.0f));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].linearAttenuation",		0.1f,						1.0f));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].quadraticAttenuation",	0.1f,						1.0f));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].spotExponent",			0.1f,						1.0f));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].spotCutoff",				0.1f,						1.0f));

	context.uniforms.push_back		(gls::VarSpec("u_directionalLightCount${NS}",						1));

	for (int i = 0; i < 4; i++)
	{
		const std::string ndxStr = de::toString(i);

		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].color",					Vec3(0.0f),					Vec3(1.0f)));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].position",				Vec4(-1.0f),				Vec4(1.0f)));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].direction",				Vec3(-1.0f),				Vec3(1.0f)));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].constantAttenuation",		0.1f,						1.0f));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].linearAttenuation",		0.1f,						1.0f));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].quadraticAttenuation",	0.1f,						1.0f));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].spotExponent",			0.1f,						1.0f));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].spotCutoff",				0.1f,						1.0f));
	}

	context.uniforms.push_back		(gls::VarSpec("u_spotLightCount${NS}",								4));

	context.uniforms.push_back		(gls::VarSpec("u_mvpMatrix${NS}",									translationMat<4>(-0.2f),	translationMat<4>(0.2f)));
	context.uniforms.push_back		(gls::VarSpec("u_modelViewMatrix${NS}",								translationMat<4>(-0.2f),	translationMat<4>(0.2f)));
	context.uniforms.push_back		(gls::VarSpec("u_normalMatrix${NS}",								translationMat<3>(-0.2f),	translationMat<3>(0.2f)));
	context.uniforms.push_back		(gls::VarSpec("u_texCoordMatrix0${NS}",								translationMat<4>(-0.2f),	translationMat<4>(0.2f)));

	context.uniforms.push_back		(gls::VarSpec("u_sampler0${NS}",									0));

	context.textureSpecs.push_back	(gls::TextureSpec(glu::TextureTestUtil::TEXTURETYPE_2D, 0,
													  texWid, texHei, GL_RGBA, GL_UNSIGNED_BYTE, GL_RGBA,
													  true, GL_LINEAR, GL_LINEAR, GL_REPEAT, GL_REPEAT,
													  Vec4(0.0f), Vec4(1.0f)));

	return context;
}